

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O1

void flatbuffers::php::PhpGenerator::BeginClass(StructDef *struct_def,string *code_ptr)

{
  long *plVar1;
  long *plVar2;
  long *local_50;
  long local_40;
  long lStack_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (struct_def->fixed == true) {
    std::operator+(&local_30,"class ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_30);
    local_50 = &local_40;
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_40 = *plVar2;
      lStack_38 = plVar1[3];
    }
    else {
      local_40 = *plVar2;
      local_50 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_50);
  }
  else {
    std::operator+(&local_30,"class ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_30);
    local_50 = &local_40;
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_40 = *plVar2;
      lStack_38 = plVar1[3];
    }
    else {
      local_40 = *plVar2;
      local_50 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_50);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

static void BeginClass(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    if (struct_def.fixed) {
      code += "class " + struct_def.name + " extends Struct\n";
    } else {
      code += "class " + struct_def.name + " extends Table\n";
    }
    code += "{\n";
  }